

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getAttributeData
          (LineRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  float fVar7;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  int local_9c;
  int local_98;
  int minorCoord;
  int majorCoord;
  int direction;
  int segmentID;
  int ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int local_78;
  undefined1 local_74 [4];
  int ndx;
  Random rnd;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> cellOrder;
  Vec4 blue;
  Vec4 green;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data_local;
  LineRenderCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.0,1.0,1.0);
  iVar1 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)(iVar1 * iVar1 * 2),&local_51);
  std::allocator<int>::~allocator(&local_51);
  de::Random::Random((Random *)local_74,0xde12345);
  local_78 = 0;
  while( true ) {
    iVar1 = local_78;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    iVar2 = local_78;
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_78);
    *pvVar4 = iVar2;
    local_78 = local_78 + 1;
  }
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_50);
  _segmentID = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_50);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_74,local_80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_segmentID);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,sVar3 << 2);
  direction = 0;
  while( true ) {
    iVar1 = direction;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    if ((int)sVar3 <= iVar1) break;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,(long)direction);
    majorCoord = *puVar5;
    minorCoord = majorCoord & 1;
    local_98 = (int)(CONCAT44(majorCoord >> 0x1f,majorCoord >> 1) /
                    (long)*(int *)&(this->super_BBoxRenderCase).field_0xd4);
    local_9c = (int)(CONCAT44(majorCoord >> 0x1f,majorCoord >> 1) %
                    (long)*(int *)&(this->super_BBoxRenderCase).field_0xd4);
    if (minorCoord == 0) {
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_cc,(float)local_98 / fVar7,(float)local_9c / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(direction << 2));
      *(undefined8 *)pvVar6->m_data = local_cc.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_cc.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(direction * 4 + 1));
      *(pointer *)pvVar6->m_data =
           cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(undefined8 *)(pvVar6->m_data + 2) = blue.m_data._0_8_;
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_dc,(float)(local_98 + 1) / fVar7,(float)local_9c / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)((direction * 2 + 1) * 2));
      *(undefined8 *)pvVar6->m_data = local_dc.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_dc.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)((direction * 2 + 1) * 2 + 1));
      *(pointer *)pvVar6->m_data =
           cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(undefined8 *)(pvVar6->m_data + 2) = blue.m_data._0_8_;
    }
    else {
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_ac,(float)local_9c / fVar7,(float)local_98 / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(direction << 2));
      *(undefined8 *)pvVar6->m_data = local_ac.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_ac.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(direction * 4 + 1));
      *(undefined8 *)pvVar6->m_data = blue.m_data._8_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = green.m_data._0_8_;
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_bc,(float)local_9c / fVar7,(float)(local_98 + 1) / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)((direction * 2 + 1) * 2));
      *(undefined8 *)pvVar6->m_data = local_bc.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_bc.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)((direction * 2 + 1) * 2 + 1));
      *(undefined8 *)pvVar6->m_data = blue.m_data._8_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = green.m_data._0_8_;
    }
    direction = direction + 1;
  }
  de::Random::~Random((Random *)local_74);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void LineRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		blue		(0.0f, 0.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder	(m_patternSide * m_patternSide * 2);
	de::Random			rnd			(0xDE12345);

	// generate crosshatch pattern with segments in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(cellOrder.size() * 4);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int segmentID		= cellOrder[ndx];
		const int direction		= segmentID & 0x01;
		const int majorCoord	= (segmentID >> 1) / m_patternSide;
		const int minorCoord	= (segmentID >> 1) % m_patternSide;

		if (direction)
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord + 1) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
		}
		else
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord + 1) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
		}
	}
}